

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiak.c
# Opt level: O1

int adiak_clustername(void)

{
  int iVar1;
  ulong uVar2;
  char *pcVar3;
  char clustername [512];
  char hostname [512];
  char local_408 [512];
  char local_208;
  char local_207 [511];
  
  memset(&local_208,0,0x200);
  memset(local_408,0,0x200);
  iVar1 = adksys_hostname(&local_208,0x200);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    uVar2 = 0;
    if (local_208 != '\0') {
      pcVar3 = local_207;
      do {
        iVar1 = (int)uVar2;
        if (9 < (byte)(local_208 - 0x30U)) {
          if (local_208 == '.') break;
          uVar2 = (ulong)(iVar1 + 1);
          local_408[iVar1] = local_208;
        }
        iVar1 = (int)uVar2;
        local_208 = *pcVar3;
        pcVar3 = pcVar3 + 1;
      } while (local_208 != '\0');
      uVar2 = (ulong)iVar1;
    }
    local_408[uVar2] = '\0';
    iVar1 = adiak_namevalue("cluster",2,"host","%s",local_408);
  }
  return iVar1;
}

Assistant:

int adiak_clustername()
{
   char hostname[512];
   char clustername[512];
   int result;
   int i = 0;
   char *c;

   memset(hostname, 0, sizeof(hostname));
   memset(clustername, 0, sizeof(hostname));
   result = adksys_hostname(hostname, sizeof(hostname));
   if (result == -1)
      return -1;

   for (c = hostname; *c; c++) {
      if (*c >= '0' && *c <= '9')
         continue;
      if (*c == '.')
         break;
      clustername[i++] = *c;
   }
   clustername[i] = '\0';

   return adiak_namevalue("cluster", adiak_general, "host", "%s", clustername);
}